

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# responseproxy.cpp
# Opt level: O0

void __thiscall
trun::TestResponseProxy::ModuleDepends(TestResponseProxy *this,char *modName,char *dependencyList)

{
  TestRunner *__s;
  char *__s_00;
  TestRunner *this_00;
  allocator<char> local_81;
  string local_80;
  allocator<char> local_49;
  string local_48;
  TestRunner *local_28;
  TestRunner *ptrRunner;
  char *dependencyList_local;
  char *modName_local;
  TestResponseProxy *this_local;
  
  ptrRunner = (TestRunner *)dependencyList;
  dependencyList_local = modName;
  modName_local = (char *)this;
  this_00 = TestRunner::GetCurrentRunner();
  __s_00 = dependencyList_local;
  local_28 = this_00;
  if (this_00 == (TestRunner *)0x0) {
    gnilk::Log::Error<char_const*>(this->pLogger,"No test runner!");
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_48,__s_00,&local_49);
    __s = ptrRunner;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_80,(char *)__s,&local_81);
    TestRunner::AddDependenciesForModule(this_00,&local_48,&local_80);
    std::__cxx11::string::~string((string *)&local_80);
    std::allocator<char>::~allocator(&local_81);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator(&local_49);
  }
  return;
}

Assistant:

void TestResponseProxy::ModuleDepends(const char *modName, const char *dependencyList) {
    auto ptrRunner = TestRunner::GetCurrentRunner();


    if (ptrRunner == nullptr) {
        pLogger->Error("No test runner!");
        return;
    }
    ptrRunner->AddDependenciesForModule(modName, dependencyList);
}